

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult __thiscall
duckdb_shell::ShellState::DisplayEntries(ShellState *this,char **azArg,idx_t nArg,char type)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  char *pcVar4;
  idx_t iVar5;
  char in_CL;
  ulong in_RDX;
  long in_RDI;
  int in_stack_00000014;
  sqlite3_stmt *in_stack_00000018;
  int in_stack_00000024;
  char *in_stack_00000028;
  int in_stack_00000034;
  sqlite3_stmt *in_stack_00000038;
  char *zSp;
  int nPrintRow;
  int nPrintCol;
  int j;
  int i;
  int maxlen;
  int len;
  int n2;
  char **azNew;
  int rc;
  string s;
  int ii;
  int nAlloc;
  int nRow;
  char **azResult;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *in_stack_000001a8;
  char **in_stack_000002d8;
  sqlite3_stmt **in_stack_000002e0;
  int in_stack_000002ec;
  char *in_stack_000002f0;
  sqlite3 *in_stack_000002f8;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  void *in_stack_fffffffffffffef0;
  char quote;
  char *pcVar6;
  sqlite3 *in_stack_fffffffffffffef8;
  ShellState *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_a0;
  int local_9c;
  int local_98;
  uint local_94;
  int local_7c;
  string local_68 [36];
  int local_44;
  int iVar7;
  void *local_38;
  MetadataResult local_1;
  
  std::__cxx11::string::string(local_68);
  OpenDB((ShellState *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
         in_stack_ffffffffffffff0c);
  if (in_RDX < 3) {
    appendText((string *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char)((ulong)in_stack_fffffffffffffef0 >> 0x38));
    appendText((string *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char)((ulong)in_stack_fffffffffffffef0 >> 0x38));
    quote = (char)((ulong)in_stack_fffffffffffffef0 >> 0x38);
    if (in_CL == 't') {
      appendText((string *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,quote);
    }
    else {
      appendText((string *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,quote);
    }
    appendText((string *)in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
               (char)((ulong)in_stack_fffffffffffffef0 >> 0x38));
    std::__cxx11::string::c_str();
    iVar1 = duckdb_shell_sqlite3_prepare_v2
                      (in_stack_000002f8,in_stack_000002f0,in_stack_000002ec,in_stack_000002e0,
                       in_stack_000002d8);
    if (iVar1 == 0) {
      iVar1 = 0;
      iVar7 = 0;
      local_38 = (void *)0x0;
      if (in_RDX < 2) {
        duckdb_shell_sqlite3_bind_text
                  (in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                   (_func_void_void_ptr *)in_stack_00000018);
      }
      else {
        duckdb_shell_sqlite3_bind_text
                  (in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024,
                   (_func_void_void_ptr *)in_stack_00000018);
      }
      while (iVar2 = duckdb_shell_sqlite3_step(in_stack_000001a8), iVar2 == 100) {
        if (iVar1 <= iVar7) {
          iVar1 = iVar1 * 2 + 10;
          local_38 = duckdb_shell_sqlite3_realloc64
                               (in_stack_fffffffffffffef0,
                                CONCAT17(in_stack_fffffffffffffeef,
                                         CONCAT16(in_stack_fffffffffffffeee,
                                                  in_stack_fffffffffffffee8)));
          if (local_38 == (void *)0x0) {
            shell_out_of_memory();
          }
        }
        puVar3 = duckdb_shell_sqlite3_column_text(in_stack_00000018,in_stack_00000014);
        pcVar4 = duckdb_shell_sqlite3_mprintf("%s",puVar3);
        *(char **)((long)local_38 + (long)iVar7 * 8) = pcVar4;
        if (*(long *)((long)local_38 + (long)iVar7 * 8) == 0) {
          shell_out_of_memory();
        }
        iVar7 = iVar7 + 1;
      }
      iVar1 = duckdb_shell_sqlite3_finalize((sqlite3_stmt *)in_stack_fffffffffffffef8);
      local_7c = 0;
      if (iVar1 != 0) {
        local_7c = ShellDatabaseError(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
      if ((local_7c == 0) && (0 < iVar7)) {
        local_94 = 0;
        for (local_98 = 0; local_98 < iVar7; local_98 = local_98 + 1) {
          iVar5 = StringLength((char *)0x1e1d9a);
          if ((int)local_94 < (int)(uint)iVar5) {
            local_94 = (uint)iVar5;
          }
        }
        local_a0 = (int)(0x50 / (long)(int)(local_94 + 2));
        if (local_a0 < 1) {
          local_a0 = 1;
        }
        local_a0 = (iVar7 + local_a0 + -1) / local_a0;
        for (local_98 = 0; local_98 < local_a0; local_98 = local_98 + 1) {
          for (local_9c = local_98; local_9c < iVar7; local_9c = local_a0 + local_9c) {
            pcVar4 = "  ";
            if (local_9c < local_a0) {
              pcVar4 = anon_var_dwarf_3e84037 + 9;
            }
            if (*(long *)((long)local_38 + (long)local_9c * 8) == 0) {
              pcVar6 = anon_var_dwarf_3e84037 + 9;
            }
            else {
              pcVar6 = *(char **)((long)local_38 + (long)local_9c * 8);
            }
            fprintf(*(FILE **)(in_RDI + 0x20),"%s%-*s",pcVar4,(ulong)local_94,pcVar6);
          }
          fprintf(*(FILE **)(in_RDI + 0x20),anon_var_dwarf_3e83f70 + 8);
        }
      }
      for (local_44 = 0; local_44 < iVar7; local_44 = local_44 + 1) {
        duckdb_shell_sqlite3_free((void *)0x1e1f5b);
      }
      duckdb_shell_sqlite3_free((void *)0x1e1f7f);
      local_1 = local_7c != 0;
    }
    else {
      local_1 = FAIL;
    }
  }
  else {
    local_1 = PRINT_USAGE;
  }
  std::__cxx11::string::~string(local_68);
  return local_1;
}

Assistant:

MetadataResult ShellState::DisplayEntries(const char **azArg, idx_t nArg, char type) {
	sqlite3_stmt *pStmt;
	char **azResult;
	int nRow, nAlloc;
	int ii;
	string s;
	OpenDB(0);
	//    rc = sqlite3_prepare_v2(db, "PRAGMA database_list", -1, &pStmt, 0);
	//    if( rc ){
	//      sqlite3_finalize(pStmt);
	//      return shellDatabaseError(db);
	//    }

	if (nArg > 2) {
		return MetadataResult::PRINT_USAGE;
	}
	//    for(ii=0; sqlite3_step(pStmt)==SQLITE_ROW; ii++){
	//      const char *zDbName = (const char*)sqlite3_column_text(pStmt, 1);
	//      if( zDbName==0 ) continue;
	//      if( s.z && s.z[0] ) appendText(&s, " UNION ALL ", 0);
	appendText(s, "SELECT name FROM ", 0);
	//      appendText(&s, zDbName, '"');
	appendText(s, "sqlite_schema ", 0);
	if (type == 't') {
		appendText(s,
		           " WHERE type IN ('table','view')"
		           "   AND name NOT LIKE 'sqlite_%'"
		           "   AND name LIKE ?1",
		           0);
	} else {
		appendText(s,
		           " WHERE type='index'"
		           "   AND tbl_name LIKE ?1",
		           0);
	}
	//    }
	//    rc = sqlite3_finalize(pStmt);
	appendText(s, " ORDER BY 1", 0);
	int rc = sqlite3_prepare_v2(db, s.c_str(), -1, &pStmt, 0);
	if (rc) {
		return MetadataResult::FAIL;
	}

	/* Run the SQL statement prepared by the above block. Store the results
	** as an array of nul-terminated strings in azResult[].  */
	nRow = nAlloc = 0;
	azResult = nullptr;
	if (nArg > 1) {
		sqlite3_bind_text(pStmt, 1, azArg[1], -1, SQLITE_TRANSIENT);
	} else {
		sqlite3_bind_text(pStmt, 1, "%", -1, SQLITE_STATIC);
	}
	while (sqlite3_step(pStmt) == SQLITE_ROW) {
		if (nRow >= nAlloc) {
			char **azNew;
			int n2 = nAlloc * 2 + 10;
			azNew = (char **)sqlite3_realloc64(azResult, sizeof(azResult[0]) * n2);
			if (azNew == 0)
				shell_out_of_memory();
			nAlloc = n2;
			azResult = azNew;
		}
		azResult[nRow] = sqlite3_mprintf("%s", sqlite3_column_text(pStmt, 0));
		if (0 == azResult[nRow])
			shell_out_of_memory();
		nRow++;
	}
	if (sqlite3_finalize(pStmt) != SQLITE_OK) {
		rc = ShellDatabaseError(db);
	}

	/* Pretty-print the contents of array azResult[] to the output */
	if (rc == 0 && nRow > 0) {
		int len, maxlen = 0;
		int i, j;
		int nPrintCol, nPrintRow;
		for (i = 0; i < nRow; i++) {
			len = StringLength(azResult[i]);
			if (len > maxlen)
				maxlen = len;
		}
		nPrintCol = 80 / (maxlen + 2);
		if (nPrintCol < 1)
			nPrintCol = 1;
		nPrintRow = (nRow + nPrintCol - 1) / nPrintCol;
		for (i = 0; i < nPrintRow; i++) {
			for (j = i; j < nRow; j += nPrintRow) {
				const char *zSp = j < nPrintRow ? "" : "  ";
				utf8_printf(out, "%s%-*s", zSp, maxlen, azResult[j] ? azResult[j] : "");
			}
			raw_printf(out, "\n");
		}
	}

	for (ii = 0; ii < nRow; ii++) {
		sqlite3_free(azResult[ii]);
	}
	sqlite3_free(azResult);
	return rc == 0 ? MetadataResult::SUCCESS : MetadataResult::FAIL;
}